

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O0

void __thiscall Imath_3_2::half::half(half *this,float f)

{
  imath_half_bits_t iVar1;
  imath_half_bits_t *in_RDI;
  float in_XMM0_Da;
  
  iVar1 = imath_float_to_half(in_XMM0_Da);
  *in_RDI = iVar1;
  return;
}

Assistant:

inline half::half (float f) IMATH_NOEXCEPT : _h (imath_float_to_half (f))
{}